

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic_enum_fuse.hpp
# Opt level: O3

optional<unsigned_long> magic_enum::detail::fuse_enum<Color,Directions>(Color head,Directions tail)

{
  undefined4 *puVar1;
  ulong uVar2;
  Color *pCVar3;
  optional<unsigned_long> oVar4;
  optional<unsigned_long> oVar5;
  
  uVar2 = 0;
  puVar1 = &values_v<Directions,(magic_enum::detail::enum_subtype)0>;
  while (*(Directions *)((long)&values_v<Directions,(magic_enum::detail::enum_subtype)0> + uVar2) !=
         tail) {
    uVar2 = uVar2 + 4;
    if (uVar2 == 0x10) goto LAB_0016de0f;
  }
  pCVar3 = &values_v<Color,(magic_enum::detail::enum_subtype)0>;
  puVar1 = (undefined4 *)0x0;
  do {
    if (*pCVar3 == head) {
      oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload._M_value = (ulong)puVar1 | uVar2;
      oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._9_7_ = (undefined7)((ulong)pCVar3 >> 8);
      oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_engaged = true;
      return (optional<unsigned_long>)
             oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>;
    }
    puVar1 = (undefined4 *)((long)puVar1 + 1);
    pCVar3 = pCVar3 + 1;
  } while (puVar1 != (undefined4 *)0x3);
LAB_0016de0f:
  oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = 0;
  oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = (unsigned_long)puVar1;
  return (optional<unsigned_long>)
         oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

constexpr optional<std::uintmax_t> fuse_enum(E head, Es... tail) noexcept {
  return fuse_one_enum(fuse_enum(tail...), head);
}